

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Dimension
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this)

{
  int iVar1;
  long lVar2;
  TPZCompElSide *pTVar3;
  
  lVar2 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  if (0 < lVar2) {
    pTVar3 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
    do {
      if (pTVar3->fEl != (TPZCompEl *)0x0) {
        iVar1 = (**(code **)(*(long *)pTVar3->fEl + 0xb0))();
        return iVar1;
      }
      pTVar3 = pTVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return -1;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::Dimension() const {
    for(int el = 0; el < fElementVec.NElements(); el++)
    {
        if(fElementVec[el])
        {
            return fElementVec[el].Element()->Dimension();
        }
    }
    return -1;
}